

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.h
# Opt level: O3

bool InliningDecider::IsInlineeLeaf(FunctionBody *inlinee)

{
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  DynamicProfileInfo *this;
  
  if ((inlinee->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
    pFVar4 = (inlinee->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar4 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      pFVar4 = (inlinee->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015a4e90,InlineBuiltInCallerPhase,sourceContextId,
                       pFVar4->functionId);
    if (bVar2) {
      if (inlinee->profiledCallSiteCount == 0) {
LAB_0055f32d:
        this = Js::FunctionBody::GetAnyDynamicProfileInfo(inlinee);
        bVar2 = Js::DynamicProfileInfo::HasLdFldCallSiteInfo(this);
        return !bVar2;
      }
    }
    else {
      bVar2 = Js::FunctionBody::HasNonBuiltInCallee(inlinee);
      if (!bVar2) goto LAB_0055f32d;
    }
  }
  return false;
}

Assistant:

static bool IsInlineeLeaf(Js::FunctionBody * const inlinee)
    {
        return inlinee->HasDynamicProfileInfo()
            && (!PHASE_OFF(Js::InlineBuiltInCallerPhase, inlinee) ? !inlinee->HasNonBuiltInCallee() : inlinee->GetProfiledCallSiteCount() == 0)
            && !inlinee->GetAnyDynamicProfileInfo()->HasLdFldCallSiteInfo();
    }